

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_ELSE(Context *ctx)

{
  uint uVar1;
  char elsebranch [32];
  char endbranch [32];
  
  if (ctx->profile_supports_nv4 == 0) {
    if (ctx->profile_supports_nv2 == 0) {
      failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
      return;
    }
    if (ctx->shader_type != MOJOSHADER_TYPE_PIXEL) {
      if (0 < ctx->branch_labels_stack_index) {
        uVar1 = ctx->assigned_branch_labels;
        ctx->assigned_branch_labels = uVar1 + 1;
        snprintf(endbranch,0x20,"branch_label%d",(ulong)uVar1);
        output_line(ctx,"BRA %s;",endbranch);
        snprintf(elsebranch,0x20,"branch_label%d",
                 (ulong)(uint)ctx->branch_labels_stack[(long)ctx->branch_labels_stack_index + -1]);
        output_line(ctx,"%s:",elsebranch);
        ctx->branch_labels_stack[(long)ctx->branch_labels_stack_index + -1] = uVar1;
        return;
      }
      __assert_fail("ctx->branch_labels_stack_index > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1ecb,"void emit_ARB1_ELSE(Context *)");
    }
  }
  output_line(ctx,"ELSE;");
  return;
}

Assistant:

static void emit_ARB1_ELSE(Context *ctx)
{
    // nv2 fragment programs (and everything nv4) have a real ELSE.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        output_line(ctx, "ELSE;");

    else if (support_nv2(ctx))
    {
        // there's no ELSE construct, but we can use a branch to a label.
        assert(ctx->branch_labels_stack_index > 0);

        // At the end of the IF block, unconditionally jump to the ENDIF.
        const int endlabel = allocate_branch_label(ctx);
        char endbranch[32];
        get_ARB1_branch_label_name(ctx,endlabel,endbranch,sizeof (endbranch));
        output_line(ctx, "BRA %s;", endbranch);

        // Now mark the ELSE section with a lable.
        const int elselabel = ctx->branch_labels_stack[ctx->branch_labels_stack_index-1];
        char elsebranch[32];
        get_ARB1_branch_label_name(ctx,elselabel,elsebranch,sizeof(elsebranch));
        output_line(ctx, "%s:", elsebranch);

        // Replace the ELSE label with the ENDIF on the label stack.
        ctx->branch_labels_stack[ctx->branch_labels_stack_index-1] = endlabel;
    } // else if

    else  // stock ARB1 has no branching.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
    } // else
}